

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-kill.c
# Opt level: O1

_Bool observe_kill_diff(wchar_t y,wchar_t x,uint8_t a,wchar_t c)

{
  borg_kill *pbVar1;
  _Bool _Var2;
  uint r_idx;
  wchar_t wVar3;
  wchar_t in_R8D;
  
  r_idx = borg_guess_race((uint8_t)y,x,(_Bool)a,c,in_R8D);
  if ((r_idx == 0) || (borg.trait[0x78] != 0)) {
    _Var2 = false;
  }
  else {
    wVar3 = borg_new_kill(r_idx,y,x);
    pbVar1 = borg_kills;
    borg_kills[wVar3].when = borg_t;
    _Var2 = true;
    if (borg_morgoth_id == pbVar1[wVar3].r_idx) {
      borg_t_morgoth = borg_t;
    }
  }
  return _Var2;
}

Assistant:

bool observe_kill_diff(int y, int x, uint8_t a, wchar_t c)
{
    int          i;
    unsigned int r_idx;

    borg_kill *kill;

    /* Guess the race */
    r_idx = borg_guess_race(a, c, false, y, x);

    /* Oops */
    if (!r_idx)
        return false;

    /* no new monsters if hallucinations */
    if (borg.trait[BI_ISIMAGE])
        return false;

    /* Create a new monster */
    i = borg_new_kill(r_idx, y, x);

    /* Get the object */
    kill = &borg_kills[i];

    /* Timestamp */
    kill->when = borg_t;

    /* Mark the Morgoth time stamp if needed */
    if (kill->r_idx == borg_morgoth_id)
        borg_t_morgoth = borg_t;

    /* Done */
    return true;
}